

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O3

int kvtree_exchange_direction_hops
              (kvtree *hash_in,kvtree *hash_out,MPI_Comm comm,kvtree_exchange_enum direction,
              int hops)

{
  int rank_send;
  int iVar1;
  uint uVar2;
  kvtree *pkVar3;
  kvtree_elem *pkVar4;
  kvtree *pkVar5;
  kvtree *pkVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int rank;
  int ranks;
  kvtree *current;
  kvtree *recv;
  kvtree *send;
  int local_78;
  uint local_74;
  kvtree *local_70;
  kvtree_exchange_enum local_64;
  kvtree *local_60;
  kvtree *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  kvtree *local_40;
  MPI_Comm local_38;
  
  local_64 = direction;
  local_50 = hops;
  local_40 = hash_out;
  MPI_Comm_rank(comm,&local_78);
  local_38 = comm;
  MPI_Comm_size(comm,&local_74);
  pkVar3 = kvtree_new();
  local_70 = pkVar3;
  for (pkVar4 = kvtree_elem_first(hash_in); pkVar4 != (kvtree_elem *)0x0;
      pkVar4 = kvtree_elem_next(pkVar4)) {
    iVar1 = kvtree_elem_key_int(pkVar4);
    pkVar5 = kvtree_elem_hash(pkVar4);
    pkVar6 = kvtree_set_kv_int(pkVar3,"D",iVar1);
    pkVar6 = kvtree_set_kv_int(pkVar6,"S",local_78);
    kvtree_merge(pkVar6,pkVar5);
  }
  if (1 < (int)local_74) {
    uVar8 = 1;
    iVar1 = 1;
    iVar7 = 0;
    do {
      pkVar3 = local_70;
      if (local_50 <= iVar7 && -1 < local_50) break;
      local_4c = (local_78 - iVar1 >> 0x1f & local_74) + (local_78 - iVar1);
      uVar2 = local_74;
      if (local_78 + iVar1 < (int)local_74) {
        uVar2 = 0;
      }
      iVar9 = (local_78 + iVar1) - uVar2;
      rank_send = iVar9;
      if (local_64 != KVTREE_EXCHANGE_RIGHT) {
        rank_send = local_4c;
        local_4c = iVar9;
      }
      local_48 = iVar7;
      local_44 = iVar1;
      pkVar3 = kvtree_new();
      local_58 = kvtree_new();
      local_60 = kvtree_new();
      pkVar5 = kvtree_get(local_70,"D");
      for (pkVar4 = kvtree_elem_first(pkVar5); pkVar4 != (kvtree_elem *)0x0;
          pkVar4 = kvtree_elem_next(pkVar4)) {
        iVar1 = kvtree_elem_key_int(pkVar4);
        pkVar5 = kvtree_elem_hash(pkVar4);
        if (iVar1 - local_78 == 0) {
          pkVar5 = kvtree_get(pkVar5,"S");
          pkVar6 = local_40;
        }
        else {
          iVar7 = local_78 - iVar1;
          if (local_64 == KVTREE_EXCHANGE_RIGHT) {
            iVar7 = iVar1 - local_78;
          }
          pkVar6 = pkVar3;
          if (((iVar7 >> 0x1f & local_74) + iVar7 & uVar8) != 0) {
            pkVar6 = local_58;
          }
          pkVar6 = kvtree_set_kv_int(pkVar6,"D",iVar1);
        }
        kvtree_merge(pkVar6,pkVar5);
      }
      kvtree_sendrecv(local_58,rank_send,local_60,local_4c,local_38);
      kvtree_merge(pkVar3,local_60);
      kvtree_delete(&local_70);
      local_70 = pkVar3;
      kvtree_delete(&local_60);
      kvtree_delete(&local_58);
      uVar8 = uVar8 * 2;
      iVar1 = local_44 * 2;
      iVar7 = local_48 + 1;
      pkVar3 = local_70;
    } while (iVar1 < (int)local_74);
  }
  pkVar3 = kvtree_get_kv_int(pkVar3,"D",local_78);
  pkVar3 = kvtree_get(pkVar3,"S");
  kvtree_merge(local_40,pkVar3);
  iVar1 = kvtree_delete(&local_70);
  return iVar1;
}

Assistant:

static int kvtree_exchange_direction_hops(
  const kvtree* hash_in,
        kvtree* hash_out,
  MPI_Comm comm,
  kvtree_exchange_enum direction,
  int hops)
{
  kvtree_elem* elem;

  /* get the size of our communicator and our position within it */
  int rank, ranks;
  MPI_Comm_rank(comm, &rank);
  MPI_Comm_size(comm, &ranks);

  /* set up current hash using input hash */
  kvtree* current = kvtree_new();
  for (elem = kvtree_elem_first(hash_in);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    /* get destination rank */
    int dest_rank = kvtree_elem_key_int(elem);

    /* copy data into current hash with DEST and SRC keys */
    kvtree* data_hash = kvtree_elem_hash(elem);
    kvtree* dest_hash = kvtree_set_kv_int(current,   "D", dest_rank);
    kvtree* src_hash  = kvtree_set_kv_int(dest_hash, "S", rank);
    kvtree_merge(src_hash, data_hash);
  }

  /* now run through Bruck's index algorithm to exchange data,
   * if hops is positive we can stop after that many steps */
  int bit = 1;
  int step = 1;
  int hop_count = 0;
  while (step < ranks && (hops < 0 || hop_count < hops)) {
    /* compute left and right ranks for this step */
    int left = rank - step;
    if (left < 0) {
      left += ranks;
    }
    int right = rank + step;
    if (right >= ranks) {
      right -= ranks;
    }

    /* determine source and destination ranks for this step */
    int dst, src;
    if (direction == KVTREE_EXCHANGE_RIGHT) {
      /* send to the right */
      dst = right;
      src = left;
    } else {
      /* send to the left */
      dst = left;
      src = right;
    }

    /* create hashes for those we'll keep, send, and receive */
    kvtree* keep = kvtree_new();
    kvtree* send = kvtree_new();
    kvtree* recv = kvtree_new();

    /* identify hashes we'll send and keep in this step */
    kvtree* dest_hash = kvtree_get(current, "D");
    for (elem = kvtree_elem_first(dest_hash);
         elem != NULL;
         elem = kvtree_elem_next(elem))
    {
      /* get destination rank and pointer to its hash */
      int dest_rank = kvtree_elem_key_int(elem);
      kvtree* elem_hash = kvtree_elem_hash(elem);

      /* compute relative distance from our rank */
      int dist;
      if (direction == KVTREE_EXCHANGE_RIGHT) {
        dist = dest_rank - rank;
      } else {
        dist = rank - dest_rank;
      }
      if (dist < 0) {
        dist += ranks;
      }

      /* copy item to send, keep, or output hash */
      if (dest_rank == rank) {
        /* we are the destination for this item, discard SRC key
         * and copy hash to output hash */
        kvtree* dest_hash = kvtree_get(elem_hash, "S");
        kvtree_merge(hash_out, dest_hash);
      } else if (dist & bit) {
        /* we send the hash if the bit is set */
        kvtree* dest_send = kvtree_set_kv_int(send, "D", dest_rank);
        kvtree_merge(dest_send, elem_hash);
      } else {
        /* otherwise, copy hash to keep */
        kvtree* dest_keep = kvtree_set_kv_int(keep, "D", dest_rank);
        kvtree_merge(dest_keep, elem_hash);
      }
    }

    /* exchange hashes with our partners */
    kvtree_sendrecv(send, dst, recv, src, comm);

    /* merge received hash into keep */
    kvtree_merge(keep, recv);

    /* delete current hash and point it to keep instead */
    kvtree_delete(&current);
    current = keep;

    /* prepare for next rount */
    kvtree_delete(&recv);
    kvtree_delete(&send);
    bit <<= 1;
    step *= 2;
    hop_count++;
  }

  /* TODO: check that all items are really destined for this rank */

  /* copy current into output hash */
  kvtree* dest_hash = kvtree_get_kv_int(current, "D", rank);
  kvtree* elem_hash = kvtree_get(dest_hash, "S");
  kvtree_merge(hash_out, elem_hash);

  /* free the current hash */
  kvtree_delete(&current);

  return KVTREE_SUCCESS;
}